

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_parse_result * __thiscall
NULLCPugiXML::xml_document__load_buffer_inplace
          (NULLCPugiXML *this,NULLCArray contents,int size,uint options,xml_encoding encoding,
          xml_document *document)

{
  undefined4 in_register_0000008c;
  xml_parse_result local_68;
  xml_parse_result *local_50;
  xml_parse_result *res;
  xml_document *doc;
  xml_document *document_local;
  xml_encoding encoding_local;
  uint options_local;
  int size_local;
  undefined4 local_24;
  NULLCPugiXML *local_1c;
  NULLCArray contents_local;
  
  doc = (xml_document *)CONCAT44(in_register_0000008c,encoding);
  encoding_local = contents.len;
  local_24 = contents.ptr._0_4_;
  document_local._0_4_ = options;
  document_local._4_4_ = size;
  _options_local = this;
  local_1c = this;
  contents_local.ptr._0_4_ = local_24;
  if ((doc->super_xml_node)._root == (xml_node_struct *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    contents_local._4_8_ = 0;
  }
  else {
    res = (xml_parse_result *)((doc->super_xml_node)._root)->header;
    if (res == (xml_parse_result *)0x0) {
      res = (xml_parse_result *)nullcAllocate(0xd0);
      ((doc->super_xml_node)._root)->header = (uintptr_t)res;
      pugi::xml_document::xml_document((xml_document *)res);
    }
    local_50 = (xml_parse_result *)nullcAllocate(0xc);
    pugi::xml_document::load_buffer_inplace
              (&local_68,(xml_document *)res,local_1c,(long)(int)encoding_local,document_local._4_4_
               ,(xml_encoding)document_local);
    xml_parse_result::operator=(local_50,&local_68);
    contents_local._4_8_ = local_50;
  }
  return (xml_parse_result *)contents_local._4_8_;
}

Assistant:

xml_parse_result* xml_document__load_buffer_inplace(NULLCArray contents, int size, unsigned int options, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_buffer_inplace(contents.ptr, size, options, encoding);
		return res;
	}